

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_CCtx_params * ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters cParams)

{
  ZSTD_compressionParameters ZVar1;
  ZSTD_compressionParameters ZVar2;
  ZSTD_paramSwitch_e ZVar3;
  int iVar4;
  size_t sVar5;
  ZSTD_CCtx_params *in_RDI;
  uint uStack0000000000000008;
  uint uStack000000000000000c;
  undefined8 in_stack_ffffffffffffffd4;
  ZSTD_CCtx_params *cctxParams;
  
  ZSTD_CCtxParams_init(in_RDI,3);
  ZVar1 = cParams;
  (in_RDI->cParams).windowLog = uStack0000000000000008;
  (in_RDI->cParams).chainLog = uStack000000000000000c;
  (in_RDI->cParams).hashLog = cParams.windowLog;
  (in_RDI->cParams).searchLog = cParams.chainLog;
  cParams._8_8_ = ZVar1._8_8_;
  (in_RDI->cParams).minMatch = cParams.hashLog;
  (in_RDI->cParams).targetLength = cParams.searchLog;
  cParams.minMatch = ZVar1.minMatch;
  (in_RDI->cParams).strategy = cParams.minMatch;
  cParams = ZVar1;
  ZVar3 = ZSTD_resolveEnableLdm
                    ((in_RDI->ldmParams).enableLdm,(ZSTD_compressionParameters *)&stack0x00000008);
  (in_RDI->ldmParams).enableLdm = ZVar3;
  if ((in_RDI->ldmParams).enableLdm == ZSTD_ps_enable) {
    ZSTD_ldm_adjustParameters(&in_RDI->ldmParams,(ZSTD_compressionParameters *)&stack0x00000008);
    if ((in_RDI->ldmParams).hashLog < (in_RDI->ldmParams).bucketSizeLog) {
      __assert_fail("cctxParams.ldmParams.hashLog >= cctxParams.ldmParams.bucketSizeLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x141,
                    "ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters)");
    }
    if (0x1f < (in_RDI->ldmParams).hashRateLog) {
      __assert_fail("cctxParams.ldmParams.hashRateLog < 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x142,
                    "ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters)");
    }
  }
  ZVar3 = ZSTD_resolveBlockSplitterMode
                    (in_RDI->useBlockSplitter,(ZSTD_compressionParameters *)&stack0x00000008);
  in_RDI->useBlockSplitter = ZVar3;
  ZVar3 = ZSTD_resolveRowMatchFinderMode
                    (in_RDI->useRowMatchFinder,(ZSTD_compressionParameters *)&stack0x00000008);
  in_RDI->useRowMatchFinder = ZVar3;
  iVar4 = ZSTD_resolveExternalSequenceValidation(in_RDI->validateSequences);
  in_RDI->validateSequences = iVar4;
  sVar5 = ZSTD_resolveMaxBlockSize(in_RDI->maxBlockSize);
  in_RDI->maxBlockSize = sVar5;
  ZVar3 = ZSTD_resolveExternalRepcodeSearch
                    (in_RDI->searchForExternalRepcodes,in_RDI->compressionLevel);
  ZVar2 = cParams;
  in_RDI->searchForExternalRepcodes = ZVar3;
  ZVar1.targetLength = (int)in_stack_ffffffffffffffd4;
  ZVar1.strategy = (int)((ulong)in_stack_ffffffffffffffd4 >> 0x20);
  ZVar1.windowLog = cParams.windowLog;
  ZVar1.chainLog = cParams.chainLog;
  ZVar1.hashLog = cParams.hashLog;
  ZVar1.searchLog = cParams.searchLog;
  ZVar1.minMatch = cParams.minMatch;
  cParams = ZVar2;
  sVar5 = ZSTD_checkCParams(ZVar1);
  if (sVar5 != 0) {
    __assert_fail("!ZSTD_checkCParams(cParams)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x14a,
                  "ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters)");
  }
  return in_RDI;
}

Assistant:

static ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(
        ZSTD_compressionParameters cParams)
{
    ZSTD_CCtx_params cctxParams;
    /* should not matter, as all cParams are presumed properly defined */
    ZSTD_CCtxParams_init(&cctxParams, ZSTD_CLEVEL_DEFAULT);
    cctxParams.cParams = cParams;

    /* Adjust advanced params according to cParams */
    cctxParams.ldmParams.enableLdm = ZSTD_resolveEnableLdm(cctxParams.ldmParams.enableLdm, &cParams);
    if (cctxParams.ldmParams.enableLdm == ZSTD_ps_enable) {
        ZSTD_ldm_adjustParameters(&cctxParams.ldmParams, &cParams);
        assert(cctxParams.ldmParams.hashLog >= cctxParams.ldmParams.bucketSizeLog);
        assert(cctxParams.ldmParams.hashRateLog < 32);
    }
    cctxParams.useBlockSplitter = ZSTD_resolveBlockSplitterMode(cctxParams.useBlockSplitter, &cParams);
    cctxParams.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(cctxParams.useRowMatchFinder, &cParams);
    cctxParams.validateSequences = ZSTD_resolveExternalSequenceValidation(cctxParams.validateSequences);
    cctxParams.maxBlockSize = ZSTD_resolveMaxBlockSize(cctxParams.maxBlockSize);
    cctxParams.searchForExternalRepcodes = ZSTD_resolveExternalRepcodeSearch(cctxParams.searchForExternalRepcodes,
                                                                             cctxParams.compressionLevel);
    assert(!ZSTD_checkCParams(cParams));
    return cctxParams;
}